

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O1

bool Cipher::loadFreqMap(char *fname,TFreqMap *res)

{
  char cVar1;
  pointer pdVar2;
  double *pdVar3;
  int iVar4;
  double *p;
  istream *piVar5;
  long lVar6;
  double *pdVar7;
  char *pcVar8;
  bool bVar9;
  double dVar10;
  int32_t nfreq;
  string gram;
  ifstream fin;
  undefined1 auStack_278 [12];
  int local_26c;
  char *local_268;
  undefined8 local_260;
  char local_258;
  undefined7 uStack_257;
  double local_248;
  value_type_conflict4 local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  res->len = 0;
  pdVar2 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar2;
  }
  printf("[+] Loading n-gram file \'%s\'\n",fname);
  std::ifstream::ifstream(local_238,fname,_S_in);
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    puts("    Failed to open file");
    bVar9 = false;
LAB_0013d51c:
    std::ifstream::~ifstream(local_238);
    return bVar9;
  }
  local_268 = &local_258;
  local_260 = 0;
  local_258 = '\0';
  local_26c = 0;
  lVar6 = 0;
  while( true ) {
    res->nTotal = lVar6;
    piVar5 = std::operator>>((istream *)local_238,(string *)&local_268);
    std::istream::operator>>(piVar5,&local_26c);
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) break;
    lVar6 = (long)local_26c + res->nTotal;
  }
  std::ios::clear((int)auStack_278 + (int)*(long *)(local_238[0] + -0x18) + 0x40);
  std::istream::seekg(local_238,0,0);
  while( true ) {
    piVar5 = std::operator>>((istream *)local_238,(string *)&local_268);
    std::istream::operator>>(piVar5,&local_26c);
    bVar9 = (bool)((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) >> 1);
    if (bVar9 != false) break;
    if (res->len == 0) {
      res->len = (int)local_260;
      local_240 = 1.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&res->prob,(long)(1 << ((char)local_260 * '\x05' & 0x1fU)),&local_240);
    }
    else if (res->len != (int)local_260) {
      puts("Error: loaded n-grams with vaying lengths");
      goto LAB_0013d500;
    }
    iVar4 = res->len + 1;
    lVar6 = 0;
    pcVar8 = local_268;
    do {
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
      lVar6 = (long)((int)lVar6 << 5) +
              (long)*(int *)((anonymous_namespace)::kCharToLetter + (long)cVar1 * 4);
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
    local_248 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
    if (local_248 < 0.5) {
      printf("Error: duplicate n-gram \'%s\'\n");
    }
    else {
      dVar10 = log10((double)local_26c / (double)res->nTotal);
      (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = dVar10;
    }
    if (local_248 < 0.5) goto LAB_0013d500;
  }
  printf("    Total n-grams loaded = %g\n",(double)res->nTotal);
  dVar10 = log(10000000.01 / (double)res->nTotal);
  res->pmin = dVar10;
  printf("    P-min = %g\n");
  pdVar3 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar7 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
    if (0.5 <= *pdVar7) {
      *pdVar7 = res->pmin;
    }
  }
LAB_0013d500:
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  goto LAB_0013d51c;
}

Assistant:

bool loadFreqMap(const char * fname, TFreqMap & res) {
        auto & len = res.len;
        auto & prob = res.prob;

        len = 0;
        prob.clear();

        printf("[+] Loading n-gram file '%s'\n", fname);
        std::ifstream fin(fname);

        if (fin.good() == false) {
            printf("    Failed to open file\n");
            return false;
        }

        std::string gram;
        int32_t nfreq = 0;
        res.nTotal = 0;

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            res.nTotal += nfreq;
        }

        fin.clear();
        fin.seekg(0);

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            if (len == 0) {
                len = gram.size();
                prob.resize(1 << (5*len), 1.0);
            } else if (len != (int) gram.size()) {
                printf("Error: loaded n-grams with vaying lengths\n");
                return false;
            }

            TCode idx = calcCode(gram.data(), len);
            if (prob[idx] < 0.5) {
                printf("Error: duplicate n-gram '%s'\n", gram.c_str());
                return false;
            }
            prob[idx] = std::log10(((double)(nfreq))/res.nTotal);
        }
        printf("    Total n-grams loaded = %g\n", (double) res.nTotal);

        res.pmin = std::log(10000000.01/res.nTotal);
        printf("    P-min = %g\n", res.pmin);
        for (auto & p : prob) {
            if (p >= 0.5) p = res.pmin;
        }

        return true;
    }